

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::writeSequentialContainer<QList<QStandardItemData>>
          (QDataStream *s,QList<QStandardItemData> *c)

{
  QStandardItemData *pQVar1;
  ulong uVar2;
  long lVar3;
  QDataStream *this;
  int iVar4;
  value_type *t;
  QStandardItemData *pQVar5;
  
  uVar2 = (c->d).size;
  if (uVar2 >> 1 < 0x7fffffff) {
    iVar4 = (int)uVar2;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar2);
      goto LAB_0055c7d9;
    }
    if (uVar2 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar4 = -2;
  }
  QDataStream::operator<<(s,iVar4);
LAB_0055c7d9:
  lVar3 = (c->d).size;
  if (lVar3 != 0) {
    pQVar5 = (c->d).ptr;
    pQVar1 = pQVar5 + lVar3;
    do {
      QDataStream::operator<<(s,pQVar5->role);
      ::operator<<(s,&pQVar5->value);
      pQVar5 = pQVar5 + 1;
    } while (pQVar5 != pQVar1);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}